

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtCollisionWorld.cpp
# Opt level: O2

void __thiscall
cbtCollisionWorld::contactPairTest
          (cbtCollisionWorld *this,cbtCollisionObject *colObjA,cbtCollisionObject *colObjB,
          ContactResultCallback *resultCallback)

{
  int iVar1;
  undefined4 extraout_var;
  cbtCollisionObjectWrapper obB;
  cbtCollisionObjectWrapper obA;
  cbtBridgedManifoldResult contactPointResult;
  long *plVar2;
  
  obA.m_shape = colObjA->m_collisionShape;
  obA.m_parent = (cbtCollisionObjectWrapper *)0x0;
  obA.m_worldTransform = &colObjA->m_worldTransform;
  obA.m_partId = -1;
  obA.m_index = -1;
  obB.m_shape = colObjB->m_collisionShape;
  obB.m_parent = (cbtCollisionObjectWrapper *)0x0;
  obB.m_worldTransform = &colObjB->m_worldTransform;
  obB.m_partId = -1;
  obB.m_index = -1;
  obB.m_collisionObject = colObjB;
  obA.m_collisionObject = colObjA;
  iVar1 = (*this->m_dispatcher1->_vptr_cbtDispatcher[2])(this->m_dispatcher1,&obA,&obB,0,2);
  plVar2 = (long *)CONCAT44(extraout_var,iVar1);
  if (plVar2 != (long *)0x0) {
    cbtBridgedManifoldResult::cbtBridgedManifoldResult(&contactPointResult,&obA,&obB,resultCallback)
    ;
    contactPointResult.super_cbtManifoldResult.m_closestPointDistanceThreshold =
         *(cbtScalar *)(resultCallback + 0x10);
    (**(code **)(*plVar2 + 0x10))(plVar2,&obA,&obB,&this->m_dispatchInfo,&contactPointResult);
    (**(code **)*plVar2)(plVar2);
    (*this->m_dispatcher1->_vptr_cbtDispatcher[0xf])(this->m_dispatcher1,plVar2);
  }
  return;
}

Assistant:

void cbtCollisionWorld::contactPairTest(cbtCollisionObject* colObjA, cbtCollisionObject* colObjB, ContactResultCallback& resultCallback)
{
	cbtCollisionObjectWrapper obA(0, colObjA->getCollisionShape(), colObjA, colObjA->getWorldTransform(), -1, -1);
	cbtCollisionObjectWrapper obB(0, colObjB->getCollisionShape(), colObjB, colObjB->getWorldTransform(), -1, -1);

	cbtCollisionAlgorithm* algorithm = getDispatcher()->findAlgorithm(&obA, &obB, 0, BT_CLOSEST_POINT_ALGORITHMS);
	if (algorithm)
	{
		cbtBridgedManifoldResult contactPointResult(&obA, &obB, resultCallback);
		contactPointResult.m_closestPointDistanceThreshold = resultCallback.m_closestDistanceThreshold;
		//discrete collision detection query
		algorithm->processCollision(&obA, &obB, getDispatchInfo(), &contactPointResult);

		algorithm->~cbtCollisionAlgorithm();
		getDispatcher()->freeCollisionAlgorithm(algorithm);
	}
}